

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O3

void test_skiplist_delete_nonexist_single(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  int fake_key;
  int key;
  ion_byte_t value [10];
  ion_skiplist_t skiplist;
  undefined4 local_60;
  undefined4 local_5c;
  undefined8 local_58;
  undefined2 local_50;
  ion_skiplist_t local_48;
  
  sl_initialize(&local_48,key_type_numeric_signed,4,10,7,1,4);
  local_48.super.compare = dictionary_compare_signed_value;
  local_5c = 0x10;
  local_58 = 0x6d206574656c6544;
  local_50 = 0x65;
  iVar2 = sl_insert(&local_48,&local_5c,&local_58);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(iVar2.error == '\0'),0x377,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar2.count == 1),0x378,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 != '\0') {
      local_60 = 0x21;
      iVar2 = sl_delete(&local_48,&local_60);
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(iVar2.error == '\x01'),0x382,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                         ,"condition was false, expected true");
      if (pVar1 != '\0') {
        pVar1 = planck_unit_assert_true
                          (tc,(uint)((ulong)iVar2 >> 0x20 == 0),899,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                           ,"condition was false, expected true");
        if (pVar1 != '\0') {
          sl_destroy(&local_48);
          return;
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_delete_nonexist_single(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	int			key = 16;
	ion_byte_t	value[10];

	strcpy((char *) value, "Delete me");

	ion_status_t status = sl_insert(&skiplist, (ion_key_t) &key, value);

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

	int fake_key = 33;

	status = sl_delete(&skiplist, (ion_key_t) &fake_key);

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	PLANCK_UNIT_ASSERT_TRUE(tc, err_item_not_found == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 0 == status.count);

	sl_destroy(&skiplist);
}